

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise1D::forward
          (ConvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int in_stack_00000060;
  int w;
  Mat *in_stack_00000068;
  Option *in_stack_00000070;
  Mat bottom_blob_bordered;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ConvolutionDepthWise1D *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_14;
  
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff80);
  make_padding(in_stack_ffffffffffffff20,
               (Mat *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (Option *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (bVar1) {
    local_14 = -100;
  }
  else {
    ncnn::Mat::create(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                      (int)in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20,
                      (Allocator *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (bVar1) {
      local_14 = -100;
    }
    else {
      local_14 = convolutiondepthwise1d
                           (in_RDI,in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0,outw,(int)elemsize,in_stack_00000060,
                            in_stack_00000068,in_stack_00000070);
      if (local_14 == 0) {
        local_14 = 0;
      }
    }
  }
  ncnn::Mat::~Mat((Mat *)0x948ac5);
  return local_14;
}

Assistant:

int ConvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}